

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.c
# Opt level: O0

file_entry * cpy_file_entry(file_entry *__return_storage_ptr__,econf_file *dest_kf,file_entry fe)

{
  char *pcVar1;
  file_entry *copied_fe;
  econf_file *dest_kf_local;
  
  pcVar1 = setGroupList(dest_kf,fe.group);
  __return_storage_ptr__->group = pcVar1;
  pcVar1 = strdup(fe.key);
  __return_storage_ptr__->key = pcVar1;
  if (fe.value == (char *)0x0) {
    __return_storage_ptr__->value = (char *)0x0;
  }
  else {
    pcVar1 = strdup(fe.value);
    __return_storage_ptr__->value = pcVar1;
  }
  if (fe.comment_before_key == (char *)0x0) {
    __return_storage_ptr__->comment_before_key = (char *)0x0;
  }
  else {
    pcVar1 = strdup(fe.comment_before_key);
    __return_storage_ptr__->comment_before_key = pcVar1;
  }
  if (fe.comment_after_value == (char *)0x0) {
    __return_storage_ptr__->comment_after_value = (char *)0x0;
  }
  else {
    pcVar1 = strdup(fe.comment_after_value);
    __return_storage_ptr__->comment_after_value = pcVar1;
  }
  __return_storage_ptr__->line_number = fe.line_number;
  __return_storage_ptr__->quotes = false;
  return __return_storage_ptr__;
}

Assistant:

struct file_entry cpy_file_entry(econf_file *dest_kf, struct file_entry fe) {
  struct file_entry copied_fe;
  copied_fe.group = setGroupList(dest_kf, fe.group);
  copied_fe.key = strdup(fe.key);
  if (fe.value)
    copied_fe.value = strdup(fe.value);
  else
    copied_fe.value = NULL;
  if (fe.comment_before_key)
    copied_fe.comment_before_key = strdup(fe.comment_before_key);
  else
    copied_fe.comment_before_key = NULL;
  if (fe.comment_after_value)
    copied_fe.comment_after_value = strdup(fe.comment_after_value);
  else
    copied_fe.comment_after_value = NULL;  
  copied_fe.line_number = fe.line_number;
  copied_fe.quotes = false;
  return copied_fe;
}